

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.cpp
# Opt level: O0

void * SBGThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  time_t tVar4;
  double local_2ee0;
  interval local_2ed8;
  double local_2ec0;
  interval local_2eb8;
  interval local_2ea0;
  double local_2e88;
  interval local_2e80;
  double local_2e68;
  interval local_2e60;
  interval local_2e48;
  double local_2e30;
  interval local_2e28;
  interval local_2e10;
  interval local_2df8;
  double local_2de0;
  interval local_2dd8;
  double local_2dc0;
  interval local_2db8;
  interval local_2da0;
  double local_2d88;
  interval local_2d80;
  double local_2d68;
  interval local_2d60;
  interval local_2d48;
  double local_2d30;
  interval local_2d28;
  double local_2d10;
  interval local_2d08;
  interval local_2cf0;
  double local_2cd8;
  interval local_2cd0;
  double local_2cb8;
  interval local_2cb0;
  interval local_2c98;
  double local_2c80;
  interval local_2c78;
  interval local_2c60;
  interval local_2c48;
  double local_2c30;
  interval local_2c28;
  double local_2c10;
  interval local_2c08;
  interval local_2bf0;
  char local_2bd8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_29cc;
  int local_29c8;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  time_t tt;
  tm t;
  undefined1 local_2928 [8];
  SBGDATA sbgdata;
  timeval tv;
  SBG sbg;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_29c8 = 0;
  sbg.yawp2 = (double)pParam;
  memset(&tv.tv_usec,0,0x1730);
  memset(&sbgdata.Yaw,0,0x10);
  memset(local_2928,0,0x11b0);
  GNSSqualitySBG = 0;
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      if (bPauseSBG == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("SBG paused.\n");
        GNSSqualitySBG = 0;
        chrono_period._68_4_ = 0;
        DisconnectSBG((SBG *)&tv.tv_usec);
      }
      if (bExit != 0) goto LAB_001b41bb;
      mSleep(100);
    }
    if (bRestartSBG != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a SBG.\n");
        GNSSqualitySBG = 0;
        chrono_period._68_4_ = 0;
        DisconnectSBG((SBG *)&tv.tv_usec);
      }
      bRestartSBG = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectSBG((SBG *)&tv.tv_usec,"SBG0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = sbg.BaudRate;
        memset(&sbgdata.Yaw,0,0x10);
        memset(local_2928,0,0x11b0);
        if (sbg.RS232Port._784_8_ != 0) {
          fclose((FILE *)sbg.RS232Port._784_8_);
          sbg.RS232Port.DevType = 0;
          sbg.RS232Port._788_4_ = 0;
        }
        if ((sbg.timeout != 0) && (sbg.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)&sbg.LastSBGData.Yaw);
          if (sVar2 == 0) {
            sprintf(local_2bd8,"sbg");
          }
          else {
            sprintf(local_2bd8,"%.127s",&sbg.LastSBGData.Yaw);
          }
          sVar2 = strlen(local_2bd8);
          local_29cc = (int)sVar2;
          do {
            local_29cc = local_29cc + -1;
            if (local_29cc < 0) break;
          } while (local_2bd8[local_29cc] != '.');
          if ((0 < local_29cc) && (sVar2 = strlen(local_2bd8), local_29cc < (int)sVar2)) {
            sVar2 = strlen(local_2bd8);
            memset(local_2bd8 + local_29cc,0,sVar2 - (long)local_29cc);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.csv",local_2bd8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          sbg.RS232Port._784_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)sbg.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create SBG data file.\n");
            goto LAB_001b41bb;
          }
          fprintf((FILE *)sbg.RS232Port._784_8_,
                  "PacketCounter;SampleTimeFine;UTC_Nano;UTC_Year;UTC_Month;UTC_Day;UTC_Hour;UTC_Minute;UTC_Second;UTC_Valid;StatusWord;Acc_X (in m/s2);Acc_Y (in m/s2);Acc_Z (in m/s2);Gyr_X (in rad/s);Gyr_Y (in rad/s);Gyr_Z (in rad/s);Mag_X;Mag_Y;Mag_Z;Roll (in deg);Pitch (in deg);Yaw (in deg);Latitude (in deg);Longitude (in deg);Altitude (in m);Vel_X (in m/s);Vel_Y (in m/s);Vel_Z (in m/s);tv_sec;tv_usec;heave_period (in s);surge (in m);sway (in m);heave (in m);\n"
                 );
          fflush((FILE *)sbg.RS232Port._784_8_);
        }
      }
      else {
        GNSSqualitySBG = 0;
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetFrameSBG((SBG *)&tv.tv_usec,(SBGDATA *)local_2928);
      if (iVar1 == 0) {
        iVar1 = gettimeofday((timeval *)&sbgdata.Yaw,(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          sbgdata.Yaw = 0.0;
          tv.tv_sec = 0;
        }
        EnterCriticalSection(&StateVariablesCS);
        local_2c10 = fmod_2PI((double)sbgdata.UTCTime._4_8_);
        interval::interval(&local_2c08,&local_2c10);
        local_2c30 = -phi_ahrs_acc;
        interval::interval(&local_2c28,&local_2c30,&phi_ahrs_acc);
        operator+(&local_2bf0,&local_2c08,&local_2c28);
        interval::operator=((interval *)&phi_ahrs,&local_2bf0);
        interval::interval(&local_2c60,&sbgdata.accZ);
        local_2c80 = -omegax_ahrs_acc;
        interval::interval(&local_2c78,&local_2c80,&omegax_ahrs_acc);
        operator+(&local_2c48,&local_2c60,&local_2c78);
        interval::operator=((interval *)&omegax_ahrs,&local_2c48);
        local_2cb8 = fmod_2PI(-sbgdata.Roll);
        interval::interval(&local_2cb0,&local_2cb8);
        local_2cd8 = -theta_ahrs_acc;
        interval::interval(&local_2cd0,&local_2cd8,&theta_ahrs_acc);
        operator+(&local_2c98,&local_2cb0,&local_2cd0);
        interval::operator=((interval *)&theta_ahrs,&local_2c98);
        local_2d10 = -sbgdata.gyrX;
        interval::interval(&local_2d08,&local_2d10);
        local_2d30 = -omegay_ahrs_acc;
        interval::interval(&local_2d28,&local_2d30,&omegay_ahrs_acc);
        operator+(&local_2cf0,&local_2d08,&local_2d28);
        interval::operator=((interval *)&omegay_ahrs,&local_2cf0);
        local_2d68 = fmod_2PI((1.5707963267948966 - sbgdata.Pitch) - angle_env);
        interval::interval(&local_2d60,&local_2d68);
        local_2d88 = -psi_ahrs_acc;
        interval::interval(&local_2d80,&local_2d88,&psi_ahrs_acc);
        operator+(&local_2d48,&local_2d60,&local_2d80);
        interval::operator=((interval *)&psi_ahrs,&local_2d48);
        local_2dc0 = -sbgdata.gyrY;
        interval::interval(&local_2db8,&local_2dc0);
        local_2de0 = -omegaz_ahrs_acc;
        interval::interval(&local_2dd8,&local_2de0,&omegaz_ahrs_acc);
        operator+(&local_2da0,&local_2db8,&local_2dd8);
        interval::operator=((interval *)&omegaz_ahrs,&local_2da0);
        interval::interval(&local_2e10,&sbgdata.temp);
        local_2e30 = -accrx_ahrs_acc;
        interval::interval(&local_2e28,&local_2e30,&accrx_ahrs_acc);
        operator+(&local_2df8,&local_2e10,&local_2e28);
        interval::operator=((interval *)&accrx_ahrs,&local_2df8);
        local_2e68 = -sbgdata.accX;
        interval::interval(&local_2e60,&local_2e68);
        local_2e88 = -accry_ahrs_acc;
        interval::interval(&local_2e80,&local_2e88,&accry_ahrs_acc);
        operator+(&local_2e48,&local_2e60,&local_2e80);
        interval::operator=((interval *)&accry_ahrs,&local_2e48);
        local_2ec0 = -sbgdata.accY;
        interval::interval(&local_2eb8,&local_2ec0);
        local_2ee0 = -accrz_ahrs_acc;
        interval::interval(&local_2ed8,&local_2ee0,&accrz_ahrs_acc);
        operator+(&local_2ea0,&local_2eb8,&local_2ed8);
        interval::operator=((interval *)&accrz_ahrs,&local_2ea0);
        if ((((sbgdata.eulerStdDev[1] <= 0.0) ||
             ((double)sbg._5848_8_ / 3.0 <= (double)sbgdata.eulerStdDev[1])) ||
            (sbgdata.eulerStdDev[2] <= 0.0)) ||
           ((double)sbg._5848_8_ / 3.0 <= (double)sbgdata.eulerStdDev[2])) {
          GNSSqualitySBG = 0;
        }
        else {
          GNSSqualitySBG = 1;
          ComputeGNSSPosition((double)sbgdata._208_8_,sbgdata.Lat,sbgdata.Long,1,0,0.0);
          t.tm_isdst = 0;
          t._36_4_ = 0;
          t.tm_mon = 0;
          t.tm_year = 0;
          t.tm_gmtoff = 0;
          t.tm_mday = (ushort)sbgdata.TS - 0x76c;
          t.tm_hour = sbgdata.TS._2_1_ - 1;
          t.tm_min._0_1_ = sbgdata.TS._3_1_;
          t.tm_sec = (uint)(byte)sbgdata.UTCTime.Nanoseconds;
          t.tm_min._1_3_ = 0;
          tt = (time_t)CONCAT14(sbgdata.UTCTime.Nanoseconds._1_1_,
                                (uint)sbgdata.UTCTime.Nanoseconds._2_1_);
          t.tm_wday = 0;
          t.tm_yday = 0;
          tVar4 = timegm((tm *)&tt);
          utc = (double)tVar4 * 1000.0 + (double)(uint)sbgdata._4484_4_ / 1000000.0;
        }
        LeaveCriticalSection(&StateVariablesCS);
        if (sbg.timeout != 0) {
          fprintf((FILE *)sbg.RS232Port._784_8_,
                  "%d;%d;%d;%d;%d;%d;%d;%d;%f;%d;%d;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.8f;%.8f;%f;%f;%f;%f;%d;%d;%f;%f;%f;%f;\n"
                  ,(double)sbgdata.UTCTime.Nanoseconds._2_1_,sbgdata.temp,sbgdata.accX,sbgdata.accY,
                  sbgdata.accZ,sbgdata.gyrX,sbgdata.gyrY,sbgdata.gyrZ,(ulong)sbgdata.gpsRawDataSize,
                  0,(ulong)(uint)sbgdata._4484_4_,(ulong)(ushort)sbgdata.TS,(uint)sbgdata.TS._2_1_,
                  (uint)sbgdata.TS._3_1_,(uint)(byte)sbgdata.UTCTime.Nanoseconds,
                  (uint)sbgdata.UTCTime.Nanoseconds._1_1_,(uint)sbgdata.UTCTime.Nanoseconds._3_1_,
                  (uint)sbgdata.gpsRawData[0xff4],sbgdata.magX,sbgdata.magY,sbgdata.q3,sbgdata.roll,
                  sbgdata.pitch,sbgdata._208_8_,sbgdata.Lat,sbgdata.Long,sbgdata.Alt,sbgdata.Vel_X,
                  sbgdata.Vel_Y,SUB84(sbgdata.Yaw,0),(int)tv.tv_sec,sbgdata._296_8_,
                  sbgdata.heave_period,sbgdata.surge,sbgdata.sway);
          fflush((FILE *)sbg.RS232Port._784_8_);
        }
      }
      else {
        printf("Connection to a SBG lost.\n");
        GNSSqualitySBG = 0;
        chrono_period._68_4_ = 0;
        DisconnectSBG((SBG *)&tv.tv_usec);
        mSleep((long)i);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_29c8 = local_29c8 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_29c8)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001b41bb:
      StopChronoQuick((CHRONO *)&errcount);
      GNSSqualitySBG = 0;
      if (sbg.RS232Port._784_8_ != 0) {
        fclose((FILE *)sbg.RS232Port._784_8_);
        sbg.RS232Port.DevType = 0;
        sbg.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectSBG((SBG *)&tv.tv_usec);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGThread(void* pParam)
{
	SBG sbg;
	struct timeval tv;
	SBGDATA sbgdata;
	struct tm t;
	time_t tt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&sbg, 0, sizeof(SBG));

	memset(&tv, 0, sizeof(tv));
	memset(&sbgdata, 0, sizeof(sbgdata));

	GNSSqualitySBG = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

#ifdef ENABLE_SBG_SDK_SUPPORT
		mSleep(threadperiod);
#endif // ENABLE_SBG_SDK_SUPPORT

		if (bPauseSBG)
		{
			if (bConnected)
			{
				printf("SBG paused.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSBG)
		{
			if (bConnected)
			{
				printf("Restarting a SBG.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
			}
			bRestartSBG = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSBG(&sbg, "SBG0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = sbg.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&sbgdata, 0, sizeof(sbgdata));

				if (sbg.pfSaveFile != NULL)
				{
					fclose(sbg.pfSaveFile); 
					sbg.pfSaveFile = NULL;
				}
				if ((sbg.bSaveRawData)&&(sbg.pfSaveFile == NULL)) 
				{
					if (strlen(sbg.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", sbg.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "sbg");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					sbg.pfSaveFile = fopen(szSaveFilePath, "w");
					if (sbg.pfSaveFile == NULL) 
					{
						printf("Unable to create SBG data file.\n");
						break;
					}
					fprintf(sbg.pfSaveFile, 
						"PacketCounter;SampleTimeFine;"
						"UTC_Nano;UTC_Year;UTC_Month;UTC_Day;UTC_Hour;UTC_Minute;UTC_Second;UTC_Valid;"
						"StatusWord;"
						"Acc_X (in m/s2);Acc_Y (in m/s2);Acc_Z (in m/s2);"
						"Gyr_X (in rad/s);Gyr_Y (in rad/s);Gyr_Z (in rad/s);"
						"Mag_X;Mag_Y;Mag_Z;"
						"Roll (in deg);Pitch (in deg);Yaw (in deg);"
						"Latitude (in deg);Longitude (in deg);Altitude (in m);"
						"Vel_X (in m/s);Vel_Y (in m/s);Vel_Z (in m/s);"
						"tv_sec;tv_usec;"
						"heave_period (in s);surge (in m);sway (in m);heave (in m);\n"
						); 
					fflush(sbg.pfSaveFile);
				}
			}
			else 
			{
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
#ifdef ENABLE_SBG_SDK_SUPPORT
			if (GetLatestDataSBG(&sbg, &sbgdata) == EXIT_SUCCESS)
#else
			if (GetFrameSBG(&sbg, &sbgdata) == EXIT_SUCCESS)
#endif // ENABLE_SBG_SDK_SUPPORT
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(sbgdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				omegax_ahrs = sbgdata.gyrX+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
				theta_ahrs = fmod_2PI(-sbgdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				omegay_ahrs = -sbgdata.gyrY+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-sbgdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				omegaz_ahrs = -sbgdata.gyrZ+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
				accrx_ahrs = sbgdata.accX+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
				accry_ahrs = -sbgdata.accY+interval(-accry_ahrs_acc, accry_ahrs_acc);
				accrz_ahrs = -sbgdata.accZ+interval(-accrz_ahrs_acc, accrz_ahrs_acc);

				// Check accuracy at 3*sigma to use GPS data.
				if ((sbgdata.positionStdDev[0] > 0)&&(sbgdata.positionStdDev[0] < sbg.gpsaccuracythreshold/3.0)&&
					(sbgdata.positionStdDev[1] > 0)&&(sbgdata.positionStdDev[1] < sbg.gpsaccuracythreshold/3.0))
				{
					GNSSqualitySBG = AUTONOMOUS_GNSS_FIX;
					ComputeGNSSPosition(sbgdata.Lat, sbgdata.Long, sbgdata.Alt, GNSSqualitySBG, 0, 0);
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = sbgdata.UTCTime.Year-1900; t.tm_mon = sbgdata.UTCTime.Month-1; t.tm_mday = sbgdata.UTCTime.Day; 
					t.tm_hour = sbgdata.UTCTime.Hour; t.tm_min = sbgdata.UTCTime.Minute; t.tm_sec = sbgdata.UTCTime.Seconds; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+sbgdata.UTCTime.Nanoseconds/1000000.0;
				}
				else
				{
					GNSSqualitySBG = GNSS_NO_FIX;
				}

				LeaveCriticalSection(&StateVariablesCS);

				if (sbg.bSaveRawData)
				{
					fprintf(sbg.pfSaveFile, 
						"%d;%d;"
						"%d;%d;%d;%d;%d;%d;%f;%d;"
						"%d;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%.8f;%.8f;%f;"
						"%f;%f;%f;"
						"%d;%d;"
						"%f;%f;%f;%f;\n", 
						(int)sbgdata.TS, (int)0, 
						(int)sbgdata.UTCTime.Nanoseconds, (int)sbgdata.UTCTime.Year, (int)sbgdata.UTCTime.Month, (int)sbgdata.UTCTime.Day, (int)sbgdata.UTCTime.Hour, (int)sbgdata.UTCTime.Minute, (double)sbgdata.UTCTime.Seconds, (int)sbgdata.UTCTime.Valid, 
						(int)sbgdata.Status, 
						sbgdata.accX, sbgdata.accY, sbgdata.accZ, 
						sbgdata.gyrX, sbgdata.gyrY, sbgdata.gyrZ, 
						sbgdata.magX, sbgdata.magY, sbgdata.magZ, 
						sbgdata.roll, sbgdata.pitch, sbgdata.yaw, 
						sbgdata.Lat, sbgdata.Long, sbgdata.Alt, 
						sbgdata.Vel_X, sbgdata.Vel_Y, sbgdata.Vel_Z, 
						(int)tv.tv_sec, (int)tv.tv_usec, 
						sbgdata.heave_period, sbgdata.surge, sbgdata.sway, sbgdata.heave
						);
					fflush(sbg.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a SBG lost.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
#ifndef ENABLE_SBG_SDK_SUPPORT
				mSleep(threadperiod);
#endif // !ENABLE_SBG_SDK_SUPPORT
			}
		}

		//printf("SBGThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}